

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

int nghttp2_hd_deflate_init(nghttp2_hd_deflater *deflater,nghttp2_mem *mem)

{
  int iVar1;
  
  iVar1 = hd_context_init(&deflater->ctx,mem);
  if (iVar1 == 0) {
    iVar1 = 0;
    memset(&deflater->map,0,0x400);
    deflater->notify_table_size_change = '\0';
    deflater->deflate_hd_table_bufsize_max = 0x1000;
    deflater->min_hd_table_bufsize_max = 0xffffffff;
  }
  return iVar1;
}

Assistant:

int nghttp2_hd_deflate_init(nghttp2_hd_deflater *deflater, nghttp2_mem *mem) {
  return nghttp2_hd_deflate_init2(
      deflater, NGHTTP2_HD_DEFAULT_MAX_DEFLATE_BUFFER_SIZE, mem);
}